

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O2

AMQP_VALUE messaging_delivery_accepted(void)

{
  ACCEPTED_HANDLE accepted;
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  
  accepted = accepted_create();
  if (accepted == (ACCEPTED_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pAVar1 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar1 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_delivery_accepted",0x8a,1,"Cannot create ACCEPTED delivery state handle"
               );
    }
  }
  else {
    pAVar1 = amqpvalue_create_accepted(accepted);
    if (pAVar1 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                  ,"messaging_delivery_accepted",0x92,1,
                  "Cannot create ACCEPTED delivery state AMQP value");
      }
    }
    accepted_destroy(accepted);
  }
  return pAVar1;
}

Assistant:

AMQP_VALUE messaging_delivery_accepted(void)
{
    AMQP_VALUE result;
    ACCEPTED_HANDLE accepted = accepted_create();
    if (accepted == NULL)
    {
        LogError("Cannot create ACCEPTED delivery state handle");
        result = NULL;
    }
    else
    {
        result = amqpvalue_create_accepted(accepted);
        if (result == NULL)
        {
            LogError("Cannot create ACCEPTED delivery state AMQP value");
        }
        else
        {
            /* all ok */
        }

        accepted_destroy(accepted);
    }

    return result;
}